

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CGL::GLScene::Mesh::draw_halfedge_arrow(Mesh *this,Halfedge *h)

{
  _List_node_base _Var1;
  _List_node_base _Var2;
  _List_node_base _Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_78;
  undefined1 local_58 [16];
  double local_48;
  undefined1 local_38 [16];
  double local_28;
  
  lVar14 = 0xb0;
  if ((Halfedge *)(this->selectedFeature).element != h) {
    lVar14 = (ulong)((Halfedge *)(this->hoveredFeature).element == h) * 8 + 0xa0;
  }
  DrawStyle::style_halfedge
            (*(DrawStyle **)((long)&(this->super_SceneObject)._vptr_SceneObject + lVar14));
  p_Var4 = (h->_next)._M_node;
  p_Var5 = (h->_vertex)._M_node;
  p_Var6 = p_Var4[2]._M_prev;
  p_Var7 = p_Var4[2]._M_next[2]._M_prev;
  _Var1 = p_Var6[2];
  _Var2 = p_Var5[2];
  auVar11 = vsubpd_avx((undefined1  [16])_Var1,(undefined1  [16])_Var2);
  p_Var4 = p_Var6[3]._M_next;
  p_Var5 = p_Var5[3]._M_next;
  _Var3 = p_Var7[2];
  auVar20 = vsubpd_avx((undefined1  [16])_Var3,(undefined1  [16])_Var1);
  p_Var6 = p_Var7[3]._M_next;
  auVar12 = vsubpd_avx((undefined1  [16])_Var2,(undefined1  [16])_Var3);
  auVar12 = vsubpd_avx(auVar11,auVar12);
  auVar11 = vsubpd_avx(auVar20,auVar11);
  local_38._0_8_ = (double)_Var2._M_next + auVar12._0_8_ * 0.5 * 0.2;
  local_38._8_8_ = (double)_Var2._M_prev + auVar12._8_8_ * 0.5 * 0.2;
  local_28 = (((double)p_Var4 - (double)p_Var5) - ((double)p_Var5 - (double)p_Var6)) * 0.5 * 0.2 +
             (double)p_Var5;
  auVar15._0_8_ = (double)_Var1._M_next + auVar11._0_8_ * 0.5 * 0.2;
  auVar15._8_8_ = (double)_Var1._M_prev + auVar11._8_8_ * 0.5 * 0.2;
  dVar8 = (double)p_Var4 +
          (((double)p_Var6 - (double)p_Var4) - ((double)p_Var4 - (double)p_Var5)) * 0.5 * 0.2;
  auVar20 = vsubpd_avx(auVar15,local_38);
  dVar13 = dVar8 - local_28;
  auVar11 = vshufpd_avx(auVar20,auVar20,1);
  dVar9 = auVar11._0_8_ * 0.2;
  local_58 = auVar15;
  local_48 = dVar8;
  Face::normal((Vector3D *)&local_78.field_0,(Face *)((h->_face)._M_node + 1));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_78.field_0.x;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar9;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar13;
  auVar11 = vunpcklpd_avx(auVar11,auVar20);
  auVar18._0_8_ = auVar11._0_8_ * 0.2;
  auVar18._8_8_ = auVar11._8_8_ * 0.2;
  auVar20._8_8_ = local_78.field_0.z;
  auVar20._0_8_ = local_78._16_8_;
  auVar11 = vunpcklpd_avx(auVar20,auVar16);
  auVar20 = vunpcklpd_avx(auVar12,auVar18);
  auVar21._0_8_ = auVar20._0_8_ * auVar11._0_8_;
  auVar21._8_8_ = auVar20._8_8_ * auVar11._8_8_;
  auVar22._0_8_ = local_78.field_0.y * auVar18._0_8_;
  auVar22._8_8_ = local_78.field_0.z * auVar18._8_8_;
  auVar20 = vsubpd_avx(auVar22,auVar21);
  auVar11 = vshufpd_avx(auVar18,auVar18,1);
  dVar13 = auVar11._0_8_ * local_78.field_0.y;
  dVar10 = local_78.field_0.x * dVar9;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar9 * -0.8660254037844387;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar11._0_8_ * -0.8660254037844387;
  auVar11 = vunpcklpd_avx(auVar19,auVar17);
  local_78.field_0.x = auVar11._0_8_ + auVar15._0_8_ + auVar20._0_8_ * 0.49999999999999994;
  local_78.field_0.y = auVar11._8_8_ + auVar15._8_8_ + auVar20._8_8_ * 0.49999999999999994;
  local_78.field_0.z =
       (dVar10 - dVar13) * 0.49999999999999994 + auVar18._0_8_ * -0.8660254037844387 + dVar8;
  glBegin(3);
  glVertex3dv(local_38);
  glVertex3dv(local_58);
  glVertex3dv(&local_78);
  glEnd();
  glLineWidth(0x3f800000);
  glPointSize(0x3f800000);
  return;
}

Assistant:

void Mesh::draw_halfedge_arrow(const Halfedge *h) const {
  get_draw_style(h)->style_halfedge();

  const Vector3D& p0 = h->vertex()->position;
  const Vector3D& p1 = h->next()->vertex()->position;
  const Vector3D& p2 = h->next()->next()->vertex()->position;

  const Vector3D& e01 = p1-p0;
  const Vector3D& e12 = p2-p1;
  const Vector3D& e20 = p0-p2;

  const Vector3D& u = (e01 - e20) / 2;
  const Vector3D& v = (e12 - e01) / 2;

  const Vector3D& a = p0 + u / 5;
  const Vector3D& b = p1 + v / 5;

  const Vector3D& s = (b-a) / 5;
  const Vector3D& t = cross(h->face()->normal(), s);
  double theta = PI * 5 / 6;
  const Vector3D& c = b + cos(theta) * s + sin(theta) * t;

  glBegin(GL_LINE_STRIP);
  glVertex3dv(&a.x);
  glVertex3dv(&b.x);
  glVertex3dv(&c.x);
  glEnd();

  get_draw_style(h)->style_reset();
}